

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void tcg_gen_gvec_sssub_mipsel
               (TCGContext_conflict4 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,uint32_t bofs,
               uint32_t oprsz,uint32_t maxsz)

{
  uint32_t oprsz_local;
  uint32_t bofs_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  uint vece_local;
  TCGContext_conflict4 *tcg_ctx_local;
  
  tcg_gen_gvec_3_mipsel(tcg_ctx,dofs,aofs,bofs,oprsz,maxsz,tcg_gen_gvec_sssub_mipsel::g + vece);
  return;
}

Assistant:

void tcg_gen_gvec_sssub(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                        uint32_t bofs, uint32_t oprsz, uint32_t maxsz)
{
    static const TCGOpcode vecop_list[] = { INDEX_op_sssub_vec, 0 };
    static const GVecGen3 g[4] = {
        { .fniv = tcg_gen_sssub_vec,
          .fno = gen_helper_gvec_sssub8,
          .opt_opc = vecop_list,
          .vece = MO_8 },
        { .fniv = tcg_gen_sssub_vec,
          .fno = gen_helper_gvec_sssub16,
          .opt_opc = vecop_list,
          .vece = MO_16 },
        { .fniv = tcg_gen_sssub_vec,
          .fno = gen_helper_gvec_sssub32,
          .opt_opc = vecop_list,
          .vece = MO_32 },
        { .fniv = tcg_gen_sssub_vec,
          .fno = gen_helper_gvec_sssub64,
          .opt_opc = vecop_list,
          .vece = MO_64 },
    };
    tcg_debug_assert(vece <= MO_64);
    tcg_gen_gvec_3(tcg_ctx, dofs, aofs, bofs, oprsz, maxsz, &g[vece]);
}